

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTests.cpp
# Opt level: O0

void __thiscall
agge::tests::PathGeneratorAdapterTests::AddingPathToSinkTranslateCloses
          (PathGeneratorAdapterTests *this)

{
  allocator local_111;
  string local_110 [32];
  LocationInfo local_f0;
  undefined1 auStack_c8 [8];
  point reference [4];
  path local_90;
  undefined1 local_60 [8];
  mock_path_sink s;
  path p;
  point input [2];
  PathGeneratorAdapterTests *this_local;
  
  p.position = 0x41b8000041300000;
  tests::mocks::path::path<agge::tests::mocks::path::point,2ul>
            ((path *)&s.points.
                      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(point (*) [2])&p.position)
  ;
  mock_path_sink::mock_path_sink((mock_path_sink *)local_60);
  tests::mocks::path::path
            (&local_90,
             (path *)&s.points.
                      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  add_path<agge::tests::PathGeneratorAdapterTests::mock_path_sink,agge::tests::mocks::path>
            ((mock_path_sink *)local_60,&local_90);
  tests::mocks::path::~path(&local_90);
  reference[2].x = 2.8026e-45;
  reference[2].y = 0.0;
  reference[2].command = 0;
  reference[3].x = 4.48416e-44;
  reference[0].command = 0;
  reference[1].x = 4.48416e-44;
  reference[1].y = 3.0;
  reference[1].command = 0x40e00000;
  auStack_c8._0_4_ = 11.0;
  auStack_c8._4_4_ = 23.0;
  reference[0].x = 2.8026e-45;
  reference[0].y = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,&local_111);
  ut::LocationInfo::LocationInfo(&local_f0,(string *)local_110,0x15d);
  ut::
  are_equal<agge::tests::mocks::path::point,4ul,std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>
            ((point (*) [4])auStack_c8,
             (vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
              *)local_60,&local_f0);
  ut::LocationInfo::~LocationInfo(&local_f0);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  mock_path_sink::~mock_path_sink((mock_path_sink *)local_60);
  tests::mocks::path::~path
            ((path *)&s.points.
                      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

test( AddingPathToSinkTranslateCloses )
			{
				// INIT
				mocks::path::point input[] = {
					{ 11.0f, 23.0f, path_command_line_to | path_flag_close },
					{ 3.0f, 7.0f, path_command_line_to | path_flag_close },
				};
				const mocks::path p(input);
				mock_path_sink s;

				// ACT
				add_path(s, p);

				// ASSERT
				mocks::path::point reference[] = {
					{ 11.0f, 23.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_flag_close },
					{ 3.0f, 7.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_flag_close },
				};

				assert_equal(reference, s.points);
			}